

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::get_dof_name_abi_cxx11_(SpatialVector *joint_dof)

{
  bool bVar1;
  ostream *poVar2;
  double *in_RSI;
  string *in_RDI;
  ostringstream dof_stream;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb38;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb40;
  ostringstream *this_00;
  allocator<char> *in_stack_fffffffffffffb60;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  double *in_stack_fffffffffffffb88;
  double *v4;
  double *in_stack_fffffffffffffb90;
  double *in_stack_fffffffffffffb98;
  double *v2;
  double *in_stack_fffffffffffffba0;
  string *this_02;
  double *in_stack_fffffffffffffbc0;
  ostringstream local_438 [383];
  allocator<char> local_2b9;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  undefined1 local_1d9 [33];
  undefined8 local_1b8;
  undefined8 local_1b0;
  allocator<char> local_169;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  allocator<char> local_f9;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  allocator<char> local_79;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  double *local_10;
  
  local_50 = 0x3ff0000000000000;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  this_02 = in_RDI;
  local_10 = in_RSI;
  SpatialVector_t::SpatialVector_t
            ((SpatialVector_t *)in_RDI,(double *)in_RDI,in_stack_fffffffffffffba0,
             in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             in_stack_fffffffffffffbc0);
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    local_d0 = 0;
    local_d8 = 0x3ff0000000000000;
    local_e0 = 0;
    local_e8 = 0;
    local_f0 = 0;
    local_f8 = 0;
    v2 = local_10;
    SpatialVector_t::SpatialVector_t
              ((SpatialVector_t *)this_02,(double *)in_RDI,in_stack_fffffffffffffba0,local_10,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffbc0);
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::allocator<char>::~allocator(&local_f9);
    }
    else {
      local_140 = 0;
      local_148 = 0;
      local_150 = 0x3ff0000000000000;
      local_158 = 0;
      local_160 = 0;
      local_168 = 0;
      v4 = local_10;
      SpatialVector_t::SpatialVector_t
                ((SpatialVector_t *)this_02,(double *)in_RDI,in_stack_fffffffffffffba0,v2,
                 in_stack_fffffffffffffb90,local_10,in_stack_fffffffffffffbc0);
      bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                        (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::allocator<char>::~allocator(&local_169);
      }
      else {
        local_1b0 = 0;
        local_1b8 = 0;
        local_1d9._25_8_ = 0;
        local_1d9._17_8_ = 0x3ff0000000000000;
        local_1d9._9_8_ = 0;
        local_1d9._1_8_ = 0;
        SpatialVector_t::SpatialVector_t
                  ((SpatialVector_t *)this_02,(double *)in_RDI,in_stack_fffffffffffffba0,v2,
                   in_stack_fffffffffffffb90,v4,in_stack_fffffffffffffbc0);
        bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                          (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        if (bVar1) {
          this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_01,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
          std::allocator<char>::~allocator((allocator<char> *)local_1d9);
        }
        else {
          SpatialVector_t::SpatialVector_t
                    ((SpatialVector_t *)this_02,(double *)in_RDI,in_stack_fffffffffffffba0,v2,
                     in_stack_fffffffffffffb90,v4,in_stack_fffffffffffffbc0);
          bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          if (bVar1) {
            __a = (allocator<char> *)&stack0xfffffffffffffdb7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffb70,(char *)local_10,__a);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
          }
          else {
            local_290 = 0;
            local_298 = 0;
            local_2a0 = 0;
            local_2a8 = 0;
            local_2b0 = 0;
            local_2b8 = 0x3ff0000000000000;
            this = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_2b8;
            SpatialVector_t::SpatialVector_t
                      ((SpatialVector_t *)this_02,(double *)in_RDI,in_stack_fffffffffffffba0,v2,
                       in_stack_fffffffffffffb90,v4,in_stack_fffffffffffffbc0);
            bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb70,(char *)local_10,in_stack_fffffffffffffb60);
              std::allocator<char>::~allocator(&local_2b9);
            }
            else {
              this_00 = local_438;
              std::__cxx11::ostringstream::ostringstream(this_00,_S_out);
              std::operator<<((ostream *)this_00,"custom_axis (");
              Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose(this);
              poVar2 = Eigen::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
              std::operator<<(poVar2,")");
              std::__cxx11::ostringstream::str();
              std::__cxx11::ostringstream::~ostringstream(local_438);
            }
          }
        }
      }
    }
  }
  return this_02;
}

Assistant:

string get_dof_name (const SpatialVector &joint_dof)
{
  if (joint_dof == SpatialVector (1., 0., 0., 0., 0., 0.)) {
    return "RX";
  } else if (joint_dof == SpatialVector (0., 1., 0., 0., 0., 0.)) {
    return "RY";
  } else if (joint_dof == SpatialVector (0., 0., 1., 0., 0., 0.)) {
    return "RZ";
  } else if (joint_dof == SpatialVector (0., 0., 0., 1., 0., 0.)) {
    return "TX";
  } else if (joint_dof == SpatialVector (0., 0., 0., 0., 1., 0.)) {
    return "TY";
  } else if (joint_dof == SpatialVector (0., 0., 0., 0., 0., 1.)) {
    return "TZ";
  }

  ostringstream dof_stream(ostringstream::out);
  dof_stream << "custom_axis (" << joint_dof.transpose() << ")";
  return dof_stream.str();
}